

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::avx::
BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
::intersect(BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  Scene *pSVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  byte bVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  RayQueryContext *pRVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  long lVar29;
  undefined4 uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  RayQueryContext *pRVar36;
  ulong uVar37;
  ulong uVar38;
  Scene *pSVar39;
  float fVar40;
  undefined1 auVar41 [16];
  float fVar50;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  undefined1 auVar47 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar64;
  float fVar77;
  float fVar78;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  float fVar76;
  undefined1 auVar74 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar79;
  float fVar99;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar96;
  float fVar98;
  float fVar100;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar95;
  float fVar97;
  undefined1 auVar94 [64];
  float fVar101;
  float fVar109;
  float fVar110;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar111;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar122;
  float fVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar127;
  float fVar128;
  undefined1 auVar126 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [64];
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar145;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar143;
  float fVar144;
  undefined1 auVar142 [64];
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar151;
  undefined1 auVar150 [64];
  undefined1 auVar152 [16];
  undefined1 auVar153 [64];
  float fVar154;
  undefined1 auVar155 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar156 [64];
  float fVar160;
  undefined1 auVar161 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar162 [64];
  float fVar166;
  undefined1 auVar167 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar168 [64];
  float fVar172;
  undefined1 auVar173 [16];
  float fVar178;
  undefined1 auVar174 [16];
  float fVar176;
  float fVar177;
  undefined1 auVar175 [64];
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar180 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2741;
  undefined8 local_2740;
  float fStack_2738;
  float fStack_2734;
  ulong local_2728;
  RayHit *local_2720;
  int local_2714;
  undefined1 local_2710 [16];
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  undefined8 local_26f0;
  float fStack_26e8;
  float fStack_26e4;
  undefined1 local_26e0 [16];
  RayQueryContext *local_26c8;
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  long local_2678;
  int *local_2670;
  RayQueryContext *local_2668;
  undefined4 *local_2660;
  Intersectors *local_2658;
  undefined4 *local_2650;
  undefined4 local_2648;
  undefined4 local_2640;
  uint local_263c;
  uint local_2638;
  undefined4 local_2634;
  undefined4 local_2630;
  undefined4 local_262c;
  uint local_2628;
  undefined4 local_2624;
  undefined4 local_2620;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [12];
  float fStack_25f4;
  undefined1 auStack_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 *local_25d0;
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [2] [16];
  undefined1 local_2540 [32];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  undefined1 local_23a0 [64];
  RTCIntersectArguments *local_2360 [1126];
  undefined1 auVar108 [64];
  
  if (*(Scene **)(*(long *)this + 0x70) != (Scene *)0x8) {
    pRVar36 = (RayQueryContext *)(local_23a0 + 0x10);
    local_23a0._0_8_ = *(Scene **)(*(long *)this + 0x70);
    local_23a0._8_4_ = 0;
    auVar51 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)((long)&This->leafIntersector + 4)));
    uVar34 = *(uint *)&(This->intersector1).intersect;
    auVar63 = ZEXT464(uVar34);
    auVar80._8_4_ = 0x7fffffff;
    auVar80._0_8_ = 0x7fffffff7fffffff;
    auVar80._12_4_ = 0x7fffffff;
    auVar80 = vandps_avx((undefined1  [16])This->collider,auVar80);
    auVar112._8_4_ = 0x219392ef;
    auVar112._0_8_ = 0x219392ef219392ef;
    auVar112._12_4_ = 0x219392ef;
    auVar80 = vcmpps_avx(auVar80,auVar112,1);
    auVar90._8_4_ = 0x3f800000;
    auVar90._0_8_ = 0x3f8000003f800000;
    auVar90._12_4_ = 0x3f800000;
    auVar112 = vdivps_avx(auVar90,(undefined1  [16])This->collider);
    auVar113._8_4_ = 0x5d5e0b6b;
    auVar113._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar113._12_4_ = 0x5d5e0b6b;
    auVar80 = vblendvps_avx(auVar112,auVar113,auVar80);
    auVar112 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(uVar34));
    auVar114._0_4_ = auVar80._0_4_ * 0.99999964;
    auVar114._4_4_ = auVar80._4_4_ * 0.99999964;
    auVar114._8_4_ = auVar80._8_4_ * 0.99999964;
    auVar114._12_4_ = auVar80._12_4_ * 0.99999964;
    uVar30 = *(undefined4 *)&This->ptr;
    local_23c0._4_4_ = uVar30;
    local_23c0._0_4_ = uVar30;
    local_23c0._8_4_ = uVar30;
    local_23c0._12_4_ = uVar30;
    local_23c0._16_4_ = uVar30;
    local_23c0._20_4_ = uVar30;
    local_23c0._24_4_ = uVar30;
    local_23c0._28_4_ = uVar30;
    auVar142 = ZEXT3264(local_23c0);
    uVar30 = *(undefined4 *)((long)&This->ptr + 4);
    local_23e0._4_4_ = uVar30;
    local_23e0._0_4_ = uVar30;
    local_23e0._8_4_ = uVar30;
    local_23e0._12_4_ = uVar30;
    local_23e0._16_4_ = uVar30;
    local_23e0._20_4_ = uVar30;
    local_23e0._24_4_ = uVar30;
    local_23e0._28_4_ = uVar30;
    auVar150 = ZEXT3264(local_23e0);
    auVar102._0_4_ = auVar80._0_4_ * 1.0000004;
    auVar102._4_4_ = auVar80._4_4_ * 1.0000004;
    auVar102._8_4_ = auVar80._8_4_ * 1.0000004;
    auVar102._12_4_ = auVar80._12_4_ * 1.0000004;
    auVar108 = ZEXT1664(auVar102);
    uVar30 = *(undefined4 *)&This->leafIntersector;
    local_2400._4_4_ = uVar30;
    local_2400._0_4_ = uVar30;
    local_2400._8_4_ = uVar30;
    local_2400._12_4_ = uVar30;
    local_2400._16_4_ = uVar30;
    local_2400._20_4_ = uVar30;
    local_2400._24_4_ = uVar30;
    local_2400._28_4_ = uVar30;
    auVar153 = ZEXT3264(local_2400);
    auVar80 = vshufps_avx(auVar114,auVar114,0);
    local_2420._16_16_ = auVar80;
    local_2420._0_16_ = auVar80;
    auVar156 = ZEXT3264(local_2420);
    auVar80 = vmovshdup_avx(auVar114);
    auVar90 = vshufps_avx(auVar114,auVar114,0x55);
    local_2440._16_16_ = auVar90;
    local_2440._0_16_ = auVar90;
    auVar162 = ZEXT3264(local_2440);
    auVar90 = vshufpd_avx(auVar114,auVar114,1);
    auVar113 = vshufps_avx(auVar114,auVar114,0xaa);
    local_2460._16_16_ = auVar113;
    local_2460._0_16_ = auVar113;
    auVar168 = ZEXT3264(local_2460);
    uVar37 = (ulong)(auVar114._0_4_ < 0.0) << 5;
    auVar113 = vshufps_avx(auVar102,auVar102,0);
    auVar121 = ZEXT1664(auVar113);
    local_2480._16_16_ = auVar113;
    local_2480._0_16_ = auVar113;
    auVar175 = ZEXT3264(local_2480);
    uVar32 = (ulong)(auVar80._0_4_ < 0.0) << 5 | 0x40;
    auVar80 = vshufps_avx(auVar102,auVar102,0x55);
    local_24a0._16_16_ = auVar80;
    local_24a0._0_16_ = auVar80;
    auVar135 = ZEXT3264(local_24a0);
    auVar80 = vshufps_avx(auVar102,auVar102,0xaa);
    auVar94 = ZEXT1664(auVar80);
    local_24c0._16_16_ = auVar80;
    local_24c0._0_16_ = auVar80;
    auVar180 = ZEXT3264(local_24c0);
    uVar35 = (ulong)(auVar90._0_4_ < 0.0) << 5 | 0x80;
    uVar38 = uVar37 ^ 0x20;
    auVar80 = vshufps_avx(auVar51,auVar51,0);
    local_2540._16_16_ = auVar80;
    local_2540._0_16_ = auVar80;
    auVar126 = ZEXT3264(local_2540);
    auVar80 = vshufps_avx(auVar112,auVar112,0);
    auVar47 = ZEXT3264(CONCAT1616(auVar80,auVar80));
    local_2610 = mm_lookupmask_ps._240_8_;
    uStack_2608 = mm_lookupmask_ps._248_8_;
    local_2728 = uVar37;
    local_2720 = ray;
LAB_00e5fdab:
    if (pRVar36 != (RayQueryContext *)local_23a0) {
      pRVar27 = pRVar36 + -1;
      pRVar36 = (RayQueryContext *)&pRVar36[-1].user;
      if (*(float *)&pRVar27->args <= auVar63._0_4_) {
        pSVar39 = *(Scene **)pRVar36;
        while (((ulong)pSVar39 & 8) == 0) {
          uVar28 = (ulong)pSVar39 & 0xfffffffffffffff0;
          fVar3 = *(float *)((long)&(This->collider).name + 4);
          auVar74._4_4_ = fVar3;
          auVar74._0_4_ = fVar3;
          auVar74._8_4_ = fVar3;
          auVar74._12_4_ = fVar3;
          auVar74._16_4_ = fVar3;
          auVar74._20_4_ = fVar3;
          auVar74._24_4_ = fVar3;
          auVar74._28_4_ = fVar3;
          pfVar2 = (float *)(uVar28 + 0x100 + uVar37);
          pfVar1 = (float *)(uVar28 + 0x40 + uVar37);
          auVar62._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar62._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar62._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar62._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar62._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar62._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar62._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar62._28_4_ = auVar63._28_4_ + pfVar1[7];
          auVar62 = vsubps_avx(auVar62,auVar142._0_32_);
          auVar18._4_4_ = auVar156._4_4_ * auVar62._4_4_;
          auVar18._0_4_ = auVar156._0_4_ * auVar62._0_4_;
          auVar18._8_4_ = auVar156._8_4_ * auVar62._8_4_;
          auVar18._12_4_ = auVar156._12_4_ * auVar62._12_4_;
          auVar18._16_4_ = auVar156._16_4_ * auVar62._16_4_;
          auVar18._20_4_ = auVar156._20_4_ * auVar62._20_4_;
          auVar18._24_4_ = auVar156._24_4_ * auVar62._24_4_;
          auVar18._28_4_ = auVar62._28_4_;
          auVar62 = vmaxps_avx(auVar126._0_32_,auVar18);
          pfVar2 = (float *)(uVar28 + 0x100 + uVar32);
          pfVar1 = (float *)(uVar28 + 0x40 + uVar32);
          auVar92._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar92._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar92._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar92._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar92._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar92._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar92._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar92._28_4_ = auVar94._28_4_ + pfVar1[7];
          auVar18 = vsubps_avx(auVar92,auVar150._0_32_);
          auVar22._4_4_ = auVar162._4_4_ * auVar18._4_4_;
          auVar22._0_4_ = auVar162._0_4_ * auVar18._0_4_;
          auVar22._8_4_ = auVar162._8_4_ * auVar18._8_4_;
          auVar22._12_4_ = auVar162._12_4_ * auVar18._12_4_;
          auVar22._16_4_ = auVar162._16_4_ * auVar18._16_4_;
          auVar22._20_4_ = auVar162._20_4_ * auVar18._20_4_;
          auVar22._24_4_ = auVar162._24_4_ * auVar18._24_4_;
          auVar22._28_4_ = auVar18._28_4_;
          pfVar2 = (float *)(uVar28 + 0x100 + uVar35);
          pfVar1 = (float *)(uVar28 + 0x40 + uVar35);
          auVar106._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar106._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar106._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar106._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar106._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar106._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar106._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar106._28_4_ = auVar108._28_4_ + pfVar1[7];
          auVar19 = vsubps_avx(auVar106,auVar153._0_32_);
          auVar23._4_4_ = auVar168._4_4_ * auVar19._4_4_;
          auVar23._0_4_ = auVar168._0_4_ * auVar19._0_4_;
          auVar23._8_4_ = auVar168._8_4_ * auVar19._8_4_;
          auVar23._12_4_ = auVar168._12_4_ * auVar19._12_4_;
          auVar23._16_4_ = auVar168._16_4_ * auVar19._16_4_;
          auVar23._20_4_ = auVar168._20_4_ * auVar19._20_4_;
          auVar23._24_4_ = auVar168._24_4_ * auVar19._24_4_;
          auVar23._28_4_ = auVar19._28_4_;
          auVar18 = vmaxps_avx(auVar22,auVar23);
          _local_2600 = vmaxps_avx(auVar62,auVar18);
          pfVar2 = (float *)(uVar28 + 0x100 + uVar38);
          pfVar1 = (float *)(uVar28 + 0x40 + uVar38);
          auVar93._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar93._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar93._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar93._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar93._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar93._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar93._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar93._28_4_ = auVar18._28_4_ + pfVar1[7];
          auVar62 = vsubps_avx(auVar93,auVar142._0_32_);
          auVar24._4_4_ = auVar175._4_4_ * auVar62._4_4_;
          auVar24._0_4_ = auVar175._0_4_ * auVar62._0_4_;
          auVar24._8_4_ = auVar175._8_4_ * auVar62._8_4_;
          auVar24._12_4_ = auVar175._12_4_ * auVar62._12_4_;
          auVar24._16_4_ = auVar175._16_4_ * auVar62._16_4_;
          auVar24._20_4_ = auVar175._20_4_ * auVar62._20_4_;
          auVar24._24_4_ = auVar175._24_4_ * auVar62._24_4_;
          auVar24._28_4_ = auVar62._28_4_;
          pfVar2 = (float *)(uVar28 + 0x100 + (uVar32 ^ 0x20));
          auVar62 = vminps_avx(auVar47._0_32_,auVar24);
          pfVar1 = (float *)(uVar28 + 0x40 + (uVar32 ^ 0x20));
          auVar107._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar107._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar107._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar107._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar107._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar107._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar107._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar107._28_4_ = auVar19._28_4_ + pfVar1[7];
          auVar18 = vsubps_avx(auVar107,auVar150._0_32_);
          pfVar2 = (float *)(uVar28 + 0x100 + (uVar35 ^ 0x20));
          pfVar1 = (float *)(uVar28 + 0x40 + (uVar35 ^ 0x20));
          auVar120._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar120._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar120._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar120._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar120._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar120._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar120._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar120._28_4_ = auVar121._28_4_ + pfVar1[7];
          auVar19._4_4_ = auVar135._4_4_ * auVar18._4_4_;
          auVar19._0_4_ = auVar135._0_4_ * auVar18._0_4_;
          auVar19._8_4_ = auVar135._8_4_ * auVar18._8_4_;
          auVar19._12_4_ = auVar135._12_4_ * auVar18._12_4_;
          auVar19._16_4_ = auVar135._16_4_ * auVar18._16_4_;
          auVar19._20_4_ = auVar135._20_4_ * auVar18._20_4_;
          auVar19._24_4_ = auVar135._24_4_ * auVar18._24_4_;
          auVar19._28_4_ = auVar18._28_4_;
          auVar18 = vsubps_avx(auVar120,auVar153._0_32_);
          auVar25._4_4_ = auVar180._4_4_ * auVar18._4_4_;
          auVar25._0_4_ = auVar180._0_4_ * auVar18._0_4_;
          auVar25._8_4_ = auVar180._8_4_ * auVar18._8_4_;
          auVar25._12_4_ = auVar180._12_4_ * auVar18._12_4_;
          auVar25._16_4_ = auVar180._16_4_ * auVar18._16_4_;
          auVar25._20_4_ = auVar180._20_4_ * auVar18._20_4_;
          auVar25._24_4_ = auVar180._24_4_ * auVar18._24_4_;
          auVar25._28_4_ = auVar18._28_4_;
          auVar121 = ZEXT3264(auVar25);
          auVar18 = vminps_avx(auVar19,auVar25);
          auVar62 = vminps_avx(auVar62,auVar18);
          auVar62 = vcmpps_avx(_local_2600,auVar62,2);
          if (((uint)pSVar39 & 7) == 6) {
            auVar18 = vcmpps_avx(*(undefined1 (*) [32])(uVar28 + 0x1c0),auVar74,2);
            auVar19 = vcmpps_avx(auVar74,*(undefined1 (*) [32])(uVar28 + 0x1e0),1);
            auVar19 = vandps_avx(auVar18,auVar19);
            auVar62 = vandps_avx(auVar19,auVar62);
            auVar80 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
          }
          else {
            auVar80 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
          }
          auVar108 = ZEXT3264(auVar18);
          auVar80 = vpsllw_avx(auVar80,0xf);
          auVar94 = ZEXT1664(auVar80);
          context = (RayQueryContext *)0x0;
          if ((((((((auVar80 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar80 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar80 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar80 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar80[0xf]) {
            auVar80 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])((long)&(This->collider).name + 4)
                                            ,0));
            auVar63 = ZEXT1664(auVar80);
            goto LAB_00e5fdab;
          }
          auVar80 = vpacksswb_avx(auVar80,auVar80);
          auVar63 = ZEXT1664(auVar80);
          bVar21 = SUB161(auVar80 >> 7,0) & 1 | (SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar80 >> 0x17,0) & 1) << 2 | (SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar80 >> 0x27,0) & 1) << 4 | (SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar80 >> 0x37,0) & 1) << 6 | SUB161(auVar80 >> 0x3f,0) << 7;
          lVar29 = 0;
          if (bVar21 != 0) {
            for (; (bVar21 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
            }
          }
          pSVar39 = *(Scene **)(uVar28 + lVar29 * 8);
          uVar34 = bVar21 - 1 & (uint)bVar21;
          context = pRVar36;
          if (uVar34 != 0) {
            uVar7 = *(uint *)(local_2600 + lVar29 * 4);
            lVar29 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            pSVar9 = *(Scene **)(uVar28 + lVar29 * 8);
            uVar8 = *(uint *)(local_2600 + lVar29 * 4);
            uVar34 = uVar34 - 1 & uVar34;
            if (uVar34 == 0) {
              context = (RayQueryContext *)&pRVar36->args;
              if (uVar7 < uVar8) {
                pRVar36->scene = pSVar9;
                *(uint *)&pRVar36->user = uVar8;
                pRVar36 = context;
              }
              else {
                pRVar36->scene = pSVar39;
                *(uint *)&pRVar36->user = uVar7;
                pRVar36 = context;
                pSVar39 = pSVar9;
              }
            }
            else {
              auVar51._8_8_ = 0;
              auVar51._0_8_ = pSVar39;
              auVar80 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar7));
              auVar65._8_8_ = 0;
              auVar65._0_8_ = pSVar9;
              auVar112 = vpunpcklqdq_avx(auVar65,ZEXT416(uVar8));
              lVar29 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *(ulong *)(uVar28 + lVar29 * 8);
              auVar51 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_2600 + lVar29 * 4)));
              auVar90 = vpcmpgtd_avx(auVar112,auVar80);
              uVar34 = uVar34 - 1 & uVar34;
              if (uVar34 == 0) {
                auVar113 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar112,auVar80,auVar113);
                auVar80 = vblendvps_avx(auVar80,auVar112,auVar113);
                auVar112 = vpcmpgtd_avx(auVar51,auVar90);
                auVar113 = vpshufd_avx(auVar112,0xaa);
                auVar112 = vblendvps_avx(auVar51,auVar90,auVar113);
                auVar108 = ZEXT1664(auVar112);
                auVar51 = vblendvps_avx(auVar90,auVar51,auVar113);
                auVar90 = vpcmpgtd_avx(auVar51,auVar80);
                auVar113 = vpshufd_avx(auVar90,0xaa);
                auVar94 = ZEXT1664(auVar113);
                auVar90 = vblendvps_avx(auVar51,auVar80,auVar113);
                auVar121 = ZEXT1664(auVar90);
                auVar80 = vblendvps_avx(auVar80,auVar51,auVar113);
                auVar63 = ZEXT1664(auVar80);
                pRVar36->scene = (Scene *)auVar80._0_8_;
                pRVar36->user = (RTCRayQueryContext *)auVar80._8_8_;
                *(undefined1 (*) [16])&pRVar36->args = auVar90;
                pSVar39 = auVar112._0_8_;
                pRVar36 = (RayQueryContext *)&pRVar36[1].user;
                context = pRVar36;
              }
              else {
                lVar29 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                auVar115._8_8_ = 0;
                auVar115._0_8_ = *(ulong *)(uVar28 + lVar29 * 8);
                auVar113 = vpunpcklqdq_avx(auVar115,ZEXT416(*(uint *)(local_2600 + lVar29 * 4)));
                uVar34 = uVar34 - 1 & uVar34;
                uVar31 = (ulong)uVar34;
                if (uVar34 == 0) {
                  auVar102 = vpshufd_avx(auVar90,0xaa);
                  auVar90 = vblendvps_avx(auVar112,auVar80,auVar102);
                  auVar80 = vblendvps_avx(auVar80,auVar112,auVar102);
                  auVar112 = vpcmpgtd_avx(auVar113,auVar51);
                  auVar102 = vpshufd_avx(auVar112,0xaa);
                  auVar112 = vblendvps_avx(auVar113,auVar51,auVar102);
                  auVar51 = vblendvps_avx(auVar51,auVar113,auVar102);
                  auVar113 = vpcmpgtd_avx(auVar51,auVar80);
                  auVar102 = vpshufd_avx(auVar113,0xaa);
                  auVar113 = vblendvps_avx(auVar51,auVar80,auVar102);
                  auVar80 = vblendvps_avx(auVar80,auVar51,auVar102);
                  auVar51 = vpcmpgtd_avx(auVar112,auVar90);
                  auVar102 = vpshufd_avx(auVar51,0xaa);
                  auVar51 = vblendvps_avx(auVar112,auVar90,auVar102);
                  auVar112 = vblendvps_avx(auVar90,auVar112,auVar102);
                  auVar90 = vpcmpgtd_avx(auVar113,auVar112);
                  auVar90 = vpshufd_avx(auVar90,0xaa);
                  auVar102 = vblendvps_avx(auVar113,auVar112,auVar90);
                  auVar112 = vblendvps_avx(auVar112,auVar113,auVar90);
                  pRVar36->scene = (Scene *)auVar80._0_8_;
                  pRVar36->user = (RTCRayQueryContext *)auVar80._8_8_;
                  *(undefined1 (*) [16])&pRVar36->args = auVar112;
                  pRVar36[1].user = (RTCRayQueryContext *)auVar102._0_8_;
                  pRVar36[1].args = (RTCIntersectArguments *)auVar102._8_8_;
                  pSVar39 = auVar51._0_8_;
                  context = pRVar36 + 2;
                }
                else {
                  pRVar36->scene = (Scene *)auVar80._0_8_;
                  pRVar36->user = (RTCRayQueryContext *)auVar80._8_8_;
                  *(undefined1 (*) [16])&pRVar36->args = auVar112;
                  pRVar36[1].user = (RTCRayQueryContext *)auVar51._0_8_;
                  pRVar36[1].args = (RTCIntersectArguments *)auVar51._8_8_;
                  context = pRVar36 + 2;
                  pRVar36[2].scene = (Scene *)auVar113._0_8_;
                  pRVar36[2].user = (RTCRayQueryContext *)auVar113._8_8_;
                  do {
                    lVar29 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                      }
                    }
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = *(ulong *)(uVar28 + lVar29 * 8);
                    auVar80 = vpunpcklqdq_avx(auVar52,ZEXT416(*(uint *)(local_2600 + lVar29 * 4)));
                    *(undefined1 (*) [16])&context->args = auVar80;
                    context = (RayQueryContext *)&context->args;
                    uVar31 = uVar31 & uVar31 - 1;
                  } while (uVar31 != 0);
                  lVar29 = 0;
                  while (context != pRVar36) {
                    auVar80 = *(undefined1 (*) [16])&pRVar36->args;
                    uVar34 = vextractps_avx(auVar80,2);
                    for (lVar33 = 0x10;
                        (lVar29 != lVar33 && (*(uint *)((long)pRVar36 + lVar33 + -8) < uVar34));
                        lVar33 = lVar33 + -0x10) {
                      *(undefined1 (*) [16])((long)&pRVar36->scene + lVar33) =
                           *(undefined1 (*) [16])((long)pRVar36 + lVar33 + -0x10);
                    }
                    *(undefined1 (*) [16])((long)&pRVar36->scene + lVar33) = auVar80;
                    lVar29 = lVar29 + -0x10;
                    pRVar36 = (RayQueryContext *)&pRVar36->args;
                  }
                  pSVar39 = *(Scene **)context;
                  ray = local_2720;
                  uVar37 = local_2728;
                }
                auVar63 = ZEXT1664(auVar80);
                auVar121 = ZEXT1664(auVar113);
                auVar108 = ZEXT1664(auVar90);
                auVar94 = ZEXT1664(auVar51);
                auVar126 = ZEXT3264(local_2540);
                pRVar36 = context;
              }
            }
          }
        }
        local_2678 = (ulong)((uint)pSVar39 & 0xf) - 8;
        uVar28 = (ulong)pSVar39 & 0xfffffffffffffff0;
        lVar29 = 0;
        while (lVar29 != local_2678) {
          lVar33 = lVar29 * 0x140;
          fVar3 = *(float *)((long)&(This->collider).name + 4);
          pfVar2 = (float *)(uVar28 + 0x90 + lVar33);
          pfVar1 = (float *)(uVar28 + lVar33);
          auVar53._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar53._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar53._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar53._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar28 + 0xa0 + lVar33);
          pfVar1 = (float *)(uVar28 + 0x10 + lVar33);
          auVar66._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar66._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar66._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar66._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar28 + 0xb0 + lVar33);
          pfVar1 = (float *)(uVar28 + 0x20 + lVar33);
          auVar155._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar155._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar155._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar155._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar28 + 0xc0 + lVar33);
          pfVar1 = (float *)(uVar28 + 0x30 + lVar33);
          auVar103._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar103._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar103._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar103._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar28 + 0xd0 + lVar33);
          pfVar1 = (float *)(uVar28 + 0x40 + lVar33);
          auVar116._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar116._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar116._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar116._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar28 + 0xe0 + lVar33);
          pfVar1 = (float *)(uVar28 + 0x50 + lVar33);
          auVar161._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar161._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar161._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar161._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar28 + 0xf0 + lVar33);
          pfVar1 = (float *)(uVar28 + 0x60 + lVar33);
          auVar137._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar137._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar137._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar137._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar28 + 0x100 + lVar33);
          pfVar1 = (float *)(uVar28 + 0x70 + lVar33);
          auVar147._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar147._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar147._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar147._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar1 = (float *)(uVar28 + 0x110 + lVar33);
          pfVar2 = (float *)(uVar28 + 0x80 + lVar33);
          auVar41._0_4_ = fVar3 * *pfVar1 + *pfVar2;
          auVar41._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
          auVar41._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
          auVar41._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
          uVar30 = *(undefined4 *)&This->ptr;
          auVar152._4_4_ = uVar30;
          auVar152._0_4_ = uVar30;
          auVar152._8_4_ = uVar30;
          auVar152._12_4_ = uVar30;
          uVar30 = *(undefined4 *)((long)&This->ptr + 4);
          auVar167._4_4_ = uVar30;
          auVar167._0_4_ = uVar30;
          auVar167._8_4_ = uVar30;
          auVar167._12_4_ = uVar30;
          uVar30 = *(undefined4 *)&This->leafIntersector;
          auVar173._4_4_ = uVar30;
          auVar173._0_4_ = uVar30;
          auVar173._8_4_ = uVar30;
          auVar173._12_4_ = uVar30;
          auVar51 = vsubps_avx(auVar53,auVar152);
          local_26a0 = vsubps_avx(auVar66,auVar167);
          local_2710 = vsubps_avx(auVar155,auVar173);
          auVar80 = vsubps_avx(auVar103,auVar152);
          auVar112 = vsubps_avx(auVar116,auVar167);
          auVar90 = vsubps_avx(auVar161,auVar173);
          auVar113 = vsubps_avx(auVar137,auVar152);
          auVar102 = vsubps_avx(auVar147,auVar167);
          auVar114 = vsubps_avx(auVar41,auVar173);
          local_26b0 = vsubps_avx(auVar113,auVar51);
          local_26c0 = vsubps_avx(auVar102,local_26a0);
          local_24d0 = vsubps_avx(auVar114,local_2710);
          fVar3 = local_26a0._0_4_;
          fVar64 = auVar102._0_4_ + fVar3;
          fVar12 = local_26a0._4_4_;
          fVar75 = auVar102._4_4_ + fVar12;
          fVar100 = local_26a0._8_4_;
          fVar76 = auVar102._8_4_ + fVar100;
          fVar15 = local_26a0._12_4_;
          fVar77 = auVar102._12_4_ + fVar15;
          fVar10 = local_2710._0_4_;
          fVar101 = auVar114._0_4_ + fVar10;
          fVar96 = local_2710._4_4_;
          fVar109 = auVar114._4_4_ + fVar96;
          fVar13 = local_2710._8_4_;
          fVar110 = auVar114._8_4_ + fVar13;
          fVar16 = local_2710._12_4_;
          fVar111 = auVar114._12_4_ + fVar16;
          fVar40 = local_24d0._0_4_;
          auVar138._0_4_ = fVar40 * fVar64;
          fVar49 = local_24d0._4_4_;
          auVar138._4_4_ = fVar49 * fVar75;
          fVar48 = local_24d0._8_4_;
          auVar138._8_4_ = fVar48 * fVar76;
          fVar50 = local_24d0._12_4_;
          auVar138._12_4_ = fVar50 * fVar77;
          fVar179 = local_26c0._0_4_;
          auVar148._0_4_ = fVar179 * fVar101;
          fVar181 = local_26c0._4_4_;
          auVar148._4_4_ = fVar181 * fVar109;
          fVar182 = local_26c0._8_4_;
          auVar148._8_4_ = fVar182 * fVar110;
          fVar183 = local_26c0._12_4_;
          auVar148._12_4_ = fVar183 * fVar111;
          auVar65 = vsubps_avx(auVar148,auVar138);
          fVar11 = auVar51._0_4_;
          fVar136 = auVar113._0_4_ + fVar11;
          fVar98 = auVar51._4_4_;
          fVar143 = auVar113._4_4_ + fVar98;
          fVar14 = auVar51._8_4_;
          fVar144 = auVar113._8_4_ + fVar14;
          fVar17 = auVar51._12_4_;
          fVar145 = auVar113._12_4_ + fVar17;
          fVar172 = local_26b0._0_4_;
          auVar104._0_4_ = fVar172 * fVar101;
          fVar176 = local_26b0._4_4_;
          auVar104._4_4_ = fVar176 * fVar109;
          fVar177 = local_26b0._8_4_;
          auVar104._8_4_ = fVar177 * fVar110;
          fVar178 = local_26b0._12_4_;
          auVar104._12_4_ = fVar178 * fVar111;
          auVar149._0_4_ = fVar136 * fVar40;
          auVar149._4_4_ = fVar143 * fVar49;
          auVar149._8_4_ = fVar144 * fVar48;
          auVar149._12_4_ = fVar145 * fVar50;
          auVar81 = vsubps_avx(auVar149,auVar104);
          auVar139._0_4_ = fVar179 * fVar136;
          auVar139._4_4_ = fVar181 * fVar143;
          auVar139._8_4_ = fVar182 * fVar144;
          auVar139._12_4_ = fVar183 * fVar145;
          auVar42._0_4_ = fVar172 * fVar64;
          auVar42._4_4_ = fVar176 * fVar75;
          auVar42._8_4_ = fVar177 * fVar76;
          auVar42._12_4_ = fVar178 * fVar77;
          auVar115 = vsubps_avx(auVar42,auVar139);
          local_26f0._4_4_ = *(float *)&(This->collider).name;
          local_2740._4_4_ = *(float *)((long)&(This->collider).collide + 4);
          local_2700 = *(float *)&(This->collider).collide;
          fStack_26fc = local_2700;
          fStack_26f8 = local_2700;
          fStack_26f4 = local_2700;
          fVar146 = auVar65._0_4_ * local_2700 +
                    local_2740._4_4_ * auVar81._0_4_ + local_26f0._4_4_ * auVar115._0_4_;
          fVar151 = auVar65._4_4_ * local_2700 +
                    local_2740._4_4_ * auVar81._4_4_ + local_26f0._4_4_ * auVar115._4_4_;
          local_24f0._0_8_ = CONCAT44(fVar151,fVar146);
          local_24f0._8_4_ =
               auVar65._8_4_ * local_2700 +
               local_2740._4_4_ * auVar81._8_4_ + local_26f0._4_4_ * auVar115._8_4_;
          local_24f0._12_4_ =
               auVar65._12_4_ * local_2700 +
               local_2740._4_4_ * auVar81._12_4_ + local_26f0._4_4_ * auVar115._12_4_;
          local_24e0 = vsubps_avx(local_26a0,auVar112);
          auVar65 = vsubps_avx(local_2710,auVar90);
          fVar64 = fVar3 + auVar112._0_4_;
          fVar75 = fVar12 + auVar112._4_4_;
          fVar76 = fVar100 + auVar112._8_4_;
          fVar77 = fVar15 + auVar112._12_4_;
          fVar101 = auVar90._0_4_ + fVar10;
          fVar110 = auVar90._4_4_ + fVar96;
          fVar136 = auVar90._8_4_ + fVar13;
          fVar144 = auVar90._12_4_ + fVar16;
          fVar166 = auVar65._0_4_;
          auVar174._0_4_ = fVar166 * fVar64;
          fVar169 = auVar65._4_4_;
          auVar174._4_4_ = fVar169 * fVar75;
          fVar170 = auVar65._8_4_;
          auVar174._8_4_ = fVar170 * fVar76;
          fVar171 = auVar65._12_4_;
          auVar174._12_4_ = fVar171 * fVar77;
          fVar109 = local_24e0._0_4_;
          auVar82._0_4_ = fVar109 * fVar101;
          fVar111 = local_24e0._4_4_;
          auVar82._4_4_ = fVar111 * fVar110;
          fVar143 = local_24e0._8_4_;
          auVar82._8_4_ = fVar143 * fVar136;
          fVar145 = local_24e0._12_4_;
          auVar82._12_4_ = fVar145 * fVar144;
          auVar65 = vsubps_avx(auVar82,auVar174);
          auVar81 = vsubps_avx(auVar51,auVar80);
          fVar154 = auVar81._0_4_;
          auVar105._0_4_ = fVar154 * fVar101;
          fVar157 = auVar81._4_4_;
          auVar105._4_4_ = fVar157 * fVar110;
          fVar158 = auVar81._8_4_;
          auVar105._8_4_ = fVar158 * fVar136;
          fVar159 = auVar81._12_4_;
          auVar105._12_4_ = fVar159 * fVar144;
          local_2690 = auVar51;
          fVar101 = auVar80._0_4_ + fVar11;
          fVar110 = auVar80._4_4_ + fVar98;
          fVar136 = auVar80._8_4_ + fVar14;
          fVar144 = auVar80._12_4_ + fVar17;
          auVar140._0_4_ = fVar166 * fVar101;
          auVar140._4_4_ = fVar169 * fVar110;
          auVar140._8_4_ = fVar170 * fVar136;
          auVar140._12_4_ = fVar171 * fVar144;
          auVar81 = vsubps_avx(auVar140,auVar105);
          auVar130._0_4_ = fVar109 * fVar101;
          auVar130._4_4_ = fVar111 * fVar110;
          auVar130._8_4_ = fVar143 * fVar136;
          auVar130._12_4_ = fVar145 * fVar144;
          auVar43._0_4_ = fVar154 * fVar64;
          auVar43._4_4_ = fVar157 * fVar75;
          auVar43._8_4_ = fVar158 * fVar76;
          auVar43._12_4_ = fVar159 * fVar77;
          auVar115 = vsubps_avx(auVar43,auVar130);
          auVar108 = ZEXT1664(CONCAT412(local_2700,
                                        CONCAT48(local_2700,CONCAT44(local_2700,local_2700))));
          local_2500._0_4_ =
               local_2700 * auVar65._0_4_ +
               local_2740._4_4_ * auVar81._0_4_ + local_26f0._4_4_ * auVar115._0_4_;
          local_2500._4_4_ =
               local_2700 * auVar65._4_4_ +
               local_2740._4_4_ * auVar81._4_4_ + local_26f0._4_4_ * auVar115._4_4_;
          local_2500._8_4_ =
               local_2700 * auVar65._8_4_ +
               local_2740._4_4_ * auVar81._8_4_ + local_26f0._4_4_ * auVar115._8_4_;
          local_2500._12_4_ =
               local_2700 * auVar65._12_4_ +
               local_2740._4_4_ * auVar81._12_4_ + local_26f0._4_4_ * auVar115._12_4_;
          auVar65 = vsubps_avx(auVar80,auVar113);
          fVar79 = auVar80._0_4_ + auVar113._0_4_;
          fVar95 = auVar80._4_4_ + auVar113._4_4_;
          fVar97 = auVar80._8_4_ + auVar113._8_4_;
          fVar99 = auVar80._12_4_ + auVar113._12_4_;
          auVar80 = vsubps_avx(auVar112,auVar102);
          fVar110 = auVar112._0_4_ + auVar102._0_4_;
          fVar136 = auVar112._4_4_ + auVar102._4_4_;
          fVar144 = auVar112._8_4_ + auVar102._8_4_;
          fVar78 = auVar112._12_4_ + auVar102._12_4_;
          auVar112 = vsubps_avx(auVar90,auVar114);
          fVar75 = auVar90._0_4_ + auVar114._0_4_;
          fVar76 = auVar90._4_4_ + auVar114._4_4_;
          fVar77 = auVar90._8_4_ + auVar114._8_4_;
          fVar101 = auVar90._12_4_ + auVar114._12_4_;
          fVar122 = auVar112._0_4_;
          auVar117._0_4_ = fVar122 * fVar110;
          fVar127 = auVar112._4_4_;
          auVar117._4_4_ = fVar127 * fVar136;
          fVar128 = auVar112._8_4_;
          auVar117._8_4_ = fVar128 * fVar144;
          fVar129 = auVar112._12_4_;
          auVar117._12_4_ = fVar129 * fVar78;
          fVar160 = auVar80._0_4_;
          auVar131._0_4_ = fVar160 * fVar75;
          fVar163 = auVar80._4_4_;
          auVar131._4_4_ = fVar163 * fVar76;
          fVar164 = auVar80._8_4_;
          auVar131._8_4_ = fVar164 * fVar77;
          fVar165 = auVar80._12_4_;
          auVar131._12_4_ = fVar165 * fVar101;
          auVar80 = vsubps_avx(auVar131,auVar117);
          fVar64 = auVar65._0_4_;
          auVar54._0_4_ = fVar64 * fVar75;
          fVar75 = auVar65._4_4_;
          auVar54._4_4_ = fVar75 * fVar76;
          fVar76 = auVar65._8_4_;
          auVar54._8_4_ = fVar76 * fVar77;
          fVar77 = auVar65._12_4_;
          auVar54._12_4_ = fVar77 * fVar101;
          auVar132._0_4_ = fVar122 * fVar79;
          auVar132._4_4_ = fVar127 * fVar95;
          auVar132._8_4_ = fVar128 * fVar97;
          auVar132._12_4_ = fVar129 * fVar99;
          auVar112 = vsubps_avx(auVar132,auVar54);
          auVar83._0_4_ = fVar160 * fVar79;
          auVar83._4_4_ = fVar163 * fVar95;
          auVar83._8_4_ = fVar164 * fVar97;
          auVar83._12_4_ = fVar165 * fVar99;
          auVar67._0_4_ = fVar64 * fVar110;
          auVar67._4_4_ = fVar75 * fVar136;
          auVar67._8_4_ = fVar76 * fVar144;
          auVar67._12_4_ = fVar77 * fVar78;
          auVar90 = vsubps_avx(auVar67,auVar83);
          local_26f0._0_4_ = local_26f0._4_4_;
          fStack_26e8 = local_26f0._4_4_;
          fStack_26e4 = local_26f0._4_4_;
          local_2740._0_4_ = local_2740._4_4_;
          fStack_2738 = local_2740._4_4_;
          fStack_2734 = local_2740._4_4_;
          auVar55._0_4_ =
               local_2700 * auVar80._0_4_ +
               local_2740._4_4_ * auVar112._0_4_ + local_26f0._4_4_ * auVar90._0_4_;
          auVar55._4_4_ =
               local_2700 * auVar80._4_4_ +
               local_2740._4_4_ * auVar112._4_4_ + local_26f0._4_4_ * auVar90._4_4_;
          auVar55._8_4_ =
               local_2700 * auVar80._8_4_ +
               local_2740._4_4_ * auVar112._8_4_ + local_26f0._4_4_ * auVar90._8_4_;
          auVar55._12_4_ =
               local_2700 * auVar80._12_4_ +
               local_2740._4_4_ * auVar112._12_4_ + local_26f0._4_4_ * auVar90._12_4_;
          local_25e0._0_4_ = auVar55._0_4_ + fVar146 + local_2500._0_4_;
          local_25e0._4_4_ = auVar55._4_4_ + fVar151 + local_2500._4_4_;
          local_25e0._8_4_ = auVar55._8_4_ + local_24f0._8_4_ + local_2500._8_4_;
          local_25e0._12_4_ = auVar55._12_4_ + local_24f0._12_4_ + local_2500._12_4_;
          auVar80 = vminps_avx(local_24f0,local_2500);
          auVar80 = vminps_avx(auVar80,auVar55);
          auVar84._8_4_ = 0x7fffffff;
          auVar84._0_8_ = 0x7fffffff7fffffff;
          auVar84._12_4_ = 0x7fffffff;
          local_2510 = vandps_avx(local_25e0,auVar84);
          auVar85._0_4_ = local_2510._0_4_ * 1.1920929e-07;
          auVar85._4_4_ = local_2510._4_4_ * 1.1920929e-07;
          auVar85._8_4_ = local_2510._8_4_ * 1.1920929e-07;
          auVar85._12_4_ = local_2510._12_4_ * 1.1920929e-07;
          auVar94 = ZEXT1664(auVar85);
          uVar31 = CONCAT44(auVar85._4_4_,auVar85._0_4_);
          auVar118._0_8_ = uVar31 ^ 0x8000000080000000;
          auVar118._8_4_ = -auVar85._8_4_;
          auVar118._12_4_ = -auVar85._12_4_;
          auVar80 = vcmpps_avx(auVar80,auVar118,5);
          auVar112 = vmaxps_avx(local_24f0,local_2500);
          auVar121 = ZEXT1664(auVar112);
          auVar112 = vmaxps_avx(auVar112,auVar55);
          auVar112 = vcmpps_avx(auVar112,auVar85,2);
          local_2520 = vorps_avx(auVar80,auVar112);
          auVar20._8_8_ = uStack_2608;
          auVar20._0_8_ = local_2610;
          auVar20 = auVar20 & local_2520;
          local_2690._0_8_ = lVar29;
          if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar20[0xf] < '\0') {
            auVar56._0_4_ = fVar40 * fVar109;
            auVar56._4_4_ = fVar49 * fVar111;
            auVar56._8_4_ = fVar48 * fVar143;
            auVar56._12_4_ = fVar50 * fVar145;
            auVar68._0_4_ = fVar179 * fVar166;
            auVar68._4_4_ = fVar181 * fVar169;
            auVar68._8_4_ = fVar182 * fVar170;
            auVar68._12_4_ = fVar183 * fVar171;
            auVar90 = vsubps_avx(auVar68,auVar56);
            auVar86._0_4_ = fVar166 * fVar160;
            auVar86._4_4_ = fVar169 * fVar163;
            auVar86._8_4_ = fVar170 * fVar164;
            auVar86._12_4_ = fVar171 * fVar165;
            auVar119._0_4_ = fVar109 * fVar122;
            auVar119._4_4_ = fVar111 * fVar127;
            auVar119._8_4_ = fVar143 * fVar128;
            auVar119._12_4_ = fVar145 * fVar129;
            auVar113 = vsubps_avx(auVar119,auVar86);
            auVar133._8_4_ = 0x7fffffff;
            auVar133._0_8_ = 0x7fffffff7fffffff;
            auVar133._12_4_ = 0x7fffffff;
            auVar80 = vandps_avx(auVar56,auVar133);
            auVar112 = vandps_avx(auVar86,auVar133);
            auVar80 = vcmpps_avx(auVar80,auVar112,1);
            local_2580 = vblendvps_avx(auVar113,auVar90,auVar80);
            auVar121 = ZEXT1664(local_2580);
            auVar57._0_4_ = fVar154 * fVar122;
            auVar57._4_4_ = fVar157 * fVar127;
            auVar57._8_4_ = fVar158 * fVar128;
            auVar57._12_4_ = fVar159 * fVar129;
            auVar69._0_4_ = fVar40 * fVar154;
            auVar69._4_4_ = fVar49 * fVar157;
            auVar69._8_4_ = fVar48 * fVar158;
            auVar69._12_4_ = fVar50 * fVar159;
            auVar87._0_4_ = fVar172 * fVar166;
            auVar87._4_4_ = fVar176 * fVar169;
            auVar87._8_4_ = fVar177 * fVar170;
            auVar87._12_4_ = fVar178 * fVar171;
            auVar90 = vsubps_avx(auVar69,auVar87);
            auVar123._0_4_ = fVar166 * fVar64;
            auVar123._4_4_ = fVar169 * fVar75;
            auVar123._8_4_ = fVar170 * fVar76;
            auVar123._12_4_ = fVar171 * fVar77;
            auVar113 = vsubps_avx(auVar123,auVar57);
            auVar80 = vandps_avx(auVar87,auVar133);
            auVar112 = vandps_avx(auVar57,auVar133);
            auVar80 = vcmpps_avx(auVar80,auVar112,1);
            local_2570 = vblendvps_avx(auVar113,auVar90,auVar80);
            auVar44._0_4_ = fVar109 * fVar64;
            auVar44._4_4_ = fVar111 * fVar75;
            auVar44._8_4_ = fVar143 * fVar76;
            auVar44._12_4_ = fVar145 * fVar77;
            auVar70._0_4_ = fVar172 * fVar109;
            auVar70._4_4_ = fVar176 * fVar111;
            auVar70._8_4_ = fVar177 * fVar143;
            auVar70._12_4_ = fVar178 * fVar145;
            auVar88._0_4_ = fVar179 * fVar154;
            auVar88._4_4_ = fVar181 * fVar157;
            auVar88._8_4_ = fVar182 * fVar158;
            auVar88._12_4_ = fVar183 * fVar159;
            auVar124._0_4_ = fVar154 * fVar160;
            auVar124._4_4_ = fVar157 * fVar163;
            auVar124._8_4_ = fVar158 * fVar164;
            auVar124._12_4_ = fVar159 * fVar165;
            auVar90 = vsubps_avx(auVar70,auVar88);
            auVar113 = vsubps_avx(auVar124,auVar44);
            auVar80 = vandps_avx(auVar88,auVar133);
            auVar112 = vandps_avx(auVar44,auVar133);
            auVar80 = vcmpps_avx(auVar80,auVar112,1);
            local_2560[0] = vblendvps_avx(auVar113,auVar90,auVar80);
            fVar40 = local_2700 * local_2580._0_4_ +
                     local_2570._0_4_ * local_2740._4_4_ + local_2560[0]._0_4_ * local_26f0._4_4_;
            fVar64 = local_2700 * local_2580._4_4_ +
                     local_2570._4_4_ * local_2740._4_4_ + local_2560[0]._4_4_ * local_26f0._4_4_;
            fVar49 = local_2700 * local_2580._8_4_ +
                     local_2570._8_4_ * local_2740._4_4_ + local_2560[0]._8_4_ * local_26f0._4_4_;
            fVar75 = local_2700 * local_2580._12_4_ +
                     local_2570._12_4_ * local_2740._4_4_ + local_2560[0]._12_4_ * local_26f0._4_4_;
            auVar45._0_4_ = fVar40 + fVar40;
            auVar45._4_4_ = fVar64 + fVar64;
            auVar45._8_4_ = fVar49 + fVar49;
            auVar45._12_4_ = fVar75 + fVar75;
            fVar40 = local_2580._0_4_ * fVar11 +
                     local_2570._0_4_ * fVar3 + local_2560[0]._0_4_ * fVar10;
            fVar96 = local_2580._4_4_ * fVar98 +
                     local_2570._4_4_ * fVar12 + local_2560[0]._4_4_ * fVar96;
            fVar98 = local_2580._8_4_ * fVar14 +
                     local_2570._8_4_ * fVar100 + local_2560[0]._8_4_ * fVar13;
            fVar100 = local_2580._12_4_ * fVar17 +
                      local_2570._12_4_ * fVar15 + local_2560[0]._12_4_ * fVar16;
            auVar80 = vrcpps_avx(auVar45);
            fVar3 = auVar80._0_4_;
            auVar134._0_4_ = auVar45._0_4_ * fVar3;
            fVar10 = auVar80._4_4_;
            auVar134._4_4_ = auVar45._4_4_ * fVar10;
            fVar11 = auVar80._8_4_;
            auVar134._8_4_ = auVar45._8_4_ * fVar11;
            fVar12 = auVar80._12_4_;
            auVar134._12_4_ = auVar45._12_4_ * fVar12;
            auVar141._8_4_ = 0x3f800000;
            auVar141._0_8_ = 0x3f8000003f800000;
            auVar141._12_4_ = 0x3f800000;
            auVar80 = vsubps_avx(auVar141,auVar134);
            local_2590._0_4_ = (fVar40 + fVar40) * (fVar3 + fVar3 * auVar80._0_4_);
            local_2590._4_4_ = (fVar96 + fVar96) * (fVar10 + fVar10 * auVar80._4_4_);
            local_2590._8_4_ = (fVar98 + fVar98) * (fVar11 + fVar11 * auVar80._8_4_);
            local_2590._12_4_ = (fVar100 + fVar100) * (fVar12 + fVar12 * auVar80._12_4_);
            auVar47 = ZEXT1664(local_2590);
            uVar30 = *(undefined4 *)((long)&This->leafIntersector + 4);
            auVar89._4_4_ = uVar30;
            auVar89._0_4_ = uVar30;
            auVar89._8_4_ = uVar30;
            auVar89._12_4_ = uVar30;
            auVar80 = vcmpps_avx(auVar89,local_2590,2);
            uVar30 = *(undefined4 *)&(This->intersector1).intersect;
            auVar125._4_4_ = uVar30;
            auVar125._0_4_ = uVar30;
            auVar125._8_4_ = uVar30;
            auVar125._12_4_ = uVar30;
            auVar112 = vcmpps_avx(local_2590,auVar125,2);
            auVar80 = vandps_avx(auVar80,auVar112);
            auVar112 = vcmpps_avx(auVar45,_DAT_01f45a50,4);
            auVar80 = vandps_avx(auVar112,auVar80);
            auVar26._8_8_ = uStack_2608;
            auVar26._0_8_ = local_2610;
            auVar112 = vandps_avx(local_2520,auVar26);
            auVar80 = vpslld_avx(auVar80,0x1f);
            auVar90 = vpsrad_avx(auVar80,0x1f);
            auVar94 = ZEXT1664(auVar90);
            auVar80 = auVar112 & auVar90;
            if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar80[0xf] < '\0') {
              local_2690._8_8_ = auVar51._8_8_;
              auVar5._0_8_ = (This->intersector1).intersect;
              auVar5._8_8_ = (This->intersector1).occluded;
              auVar63 = ZEXT1664(auVar5);
              auVar112 = vandps_avx(auVar90,auVar112);
              local_2600._8_4_ = local_24f0._8_4_;
              local_2600._0_8_ = local_24f0._0_8_;
              fStack_25f4 = local_24f0._12_4_;
              auVar108 = ZEXT1664(local_2500);
              auStack_25f0 = local_2500;
              local_25d0 = &local_2741;
              local_25c0 = auVar112;
              local_26f0 = *(undefined8 *)&(ray->super_RayK<1>).org.field_0;
              local_26e0 = auVar112;
              auVar80 = vrcpps_avx(local_25e0);
              fVar3 = auVar80._0_4_;
              auVar71._0_4_ = local_25e0._0_4_ * fVar3;
              fVar10 = auVar80._4_4_;
              auVar71._4_4_ = local_25e0._4_4_ * fVar10;
              fVar11 = auVar80._8_4_;
              auVar71._8_4_ = local_25e0._8_4_ * fVar11;
              fVar12 = auVar80._12_4_;
              auVar71._12_4_ = local_25e0._12_4_ * fVar12;
              auVar91._8_4_ = 0x3f800000;
              auVar91._0_8_ = 0x3f8000003f800000;
              auVar91._12_4_ = 0x3f800000;
              auVar80 = vsubps_avx(auVar91,auVar71);
              auVar58._0_4_ = fVar3 + fVar3 * auVar80._0_4_;
              auVar58._4_4_ = fVar10 + fVar10 * auVar80._4_4_;
              auVar58._8_4_ = fVar11 + fVar11 * auVar80._8_4_;
              auVar58._12_4_ = fVar12 + fVar12 * auVar80._12_4_;
              auVar72._8_4_ = 0x219392ef;
              auVar72._0_8_ = 0x219392ef219392ef;
              auVar72._12_4_ = 0x219392ef;
              auVar121 = ZEXT1664(local_2510);
              auVar80 = vcmpps_avx(local_2510,auVar72,5);
              auVar80 = vandps_avx(auVar80,auVar58);
              auVar73._0_4_ = fVar146 * auVar80._0_4_;
              auVar73._4_4_ = fVar151 * auVar80._4_4_;
              auVar73._8_4_ = local_24f0._8_4_ * auVar80._8_4_;
              auVar73._12_4_ = local_24f0._12_4_ * auVar80._12_4_;
              local_25b0 = vminps_avx(auVar73,auVar91);
              auVar59._0_4_ = local_2500._0_4_ * auVar80._0_4_;
              auVar59._4_4_ = local_2500._4_4_ * auVar80._4_4_;
              auVar59._8_4_ = local_2500._8_4_ * auVar80._8_4_;
              auVar59._12_4_ = local_2500._12_4_ * auVar80._12_4_;
              local_25a0 = vminps_avx(auVar59,auVar91);
              auVar60._8_4_ = 0x7f800000;
              auVar60._0_8_ = 0x7f8000007f800000;
              auVar60._12_4_ = 0x7f800000;
              auVar80 = vblendvps_avx(auVar60,local_2590,auVar112);
              auVar51 = vshufps_avx(auVar80,auVar80,0xb1);
              auVar51 = vminps_avx(auVar51,auVar80);
              auVar90 = vshufpd_avx(auVar51,auVar51,1);
              auVar51 = vminps_avx(auVar90,auVar51);
              auVar80 = vcmpps_avx(auVar80,auVar51,0);
              auVar51 = auVar112 & auVar80;
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar51[0xf] < '\0') {
                auVar112 = vandps_avx(auVar80,auVar112);
              }
              uVar34 = vextractps_avx(auVar5,1);
              uVar30 = vmovmskps_avx(auVar112);
              uVar31 = CONCAT44((int)((ulong)context >> 0x20),uVar30);
              context = (RayQueryContext *)0x0;
              if (uVar31 != 0) {
                for (; (uVar31 >> (long)context & 1) == 0;
                    context = (RayQueryContext *)((long)&context->scene + 1)) {
                }
              }
              local_2740 = lVar33 + uVar28;
              lVar29 = lVar33 + uVar28;
LAB_00e60785:
              local_26c0 = auVar63._0_16_;
              auVar94 = ZEXT1664(auVar90);
              local_2628 = *(uint *)(lVar29 + 0x120 + (long)context * 4);
              lVar29 = *(long *)(*(long *)(local_26f0 + 0x1e8) + (ulong)local_2628 * 8);
              if ((*(uint *)(lVar29 + 0x34) & uVar34) == 0) {
                *(undefined4 *)(local_26e0 + (long)context * 4) = 0;
              }
              else {
                local_2700 = SUB84(context,0);
                fStack_26fc = (float)((ulong)context >> 0x20);
                lVar33 = *(long *)&(ray->super_RayK<1>).dir.field_0;
                local_26a0._0_8_ = lVar33;
                if (*(long *)(lVar33 + 0x10) == 0) {
                  local_2660 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  if (*(long *)(lVar29 + 0x40) == 0) {
                    uVar30 = *(undefined4 *)(local_25b0 + (long)context * 4);
                    uVar4 = *(undefined4 *)(local_25a0 + (long)context * 4);
                    *(undefined4 *)&(This->intersector1).intersect =
                         *(undefined4 *)(local_2590 + (long)context * 4);
                    *(undefined4 *)&(This->intersector1).pointQuery =
                         *(undefined4 *)(local_2580 + (long)context * 4);
                    *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                         *(undefined4 *)(local_2570 + (long)context * 4);
                    *(undefined4 *)&(This->intersector1).name =
                         *(undefined4 *)(local_2560[0] + (long)context * 4);
                    *(undefined4 *)((long)&(This->intersector1).name + 4) = uVar30;
                    *(undefined4 *)&(This->intersector4).intersect = uVar4;
                    *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                         *(undefined4 *)(local_2740 + 0x130 + (long)context * 4);
                    *(uint *)&(This->intersector4).occluded = local_2628;
                    context = (RayQueryContext *)0x0;
                    *(undefined4 *)((long)&(This->intersector4).occluded + 4) = *local_2660;
                    *(undefined4 *)&(This->intersector4).name = local_2660[1];
                    goto LAB_00e60b35;
                  }
                }
                else {
                  local_2660 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                }
                local_263c = *(uint *)(local_2570 + (long)context * 4);
                auVar94 = ZEXT464(local_263c);
                local_2638 = *(uint *)(local_2560[0] + (long)context * 4);
                auVar108 = ZEXT464(local_2638);
                local_2640 = *(undefined4 *)(local_2580 + (long)context * 4);
                local_2634 = *(undefined4 *)(local_25b0 + (long)context * 4);
                local_2630 = *(undefined4 *)(local_25a0 + (long)context * 4);
                local_262c = *(undefined4 *)(local_2740 + 0x130 + (long)context * 4);
                local_2624 = *local_2660;
                local_2620 = local_2660[1];
                *(undefined4 *)&(This->intersector1).intersect =
                     *(undefined4 *)(local_2590 + (long)context * 4);
                local_2714 = -1;
                local_2670 = &local_2714;
                context = *(RayQueryContext **)(lVar29 + 0x18);
                local_2668 = context;
                local_2658 = This;
                local_2650 = &local_2640;
                local_2648 = 1;
                local_2710._0_8_ = lVar29;
                local_26c8 = pRVar36;
                local_26b0 = auVar47._0_16_;
                if (*(code **)(lVar29 + 0x40) == (code *)0x0) {
LAB_00e609a5:
                  if ((*(RTCIntersectArguments **)(local_26a0._0_8_ + 0x10) !=
                       (RTCIntersectArguments *)0x0) &&
                     ((context = (RayQueryContext *)local_26a0._0_8_,
                      ((ulong)*(Scene **)local_26a0._0_8_ & 2) != 0 ||
                      (context = (RayQueryContext *)local_2710._0_8_,
                      ((ulong)((RayQueryContext *)(local_2710._0_8_ + 0x30))->user &
                      0x40000000000000) != 0)))) {
                    auVar94 = ZEXT1664(auVar94._0_16_);
                    auVar108 = ZEXT1664(auVar108._0_16_);
                    auVar121 = ZEXT1664(auVar121._0_16_);
                    (*(code *)*(RTCIntersectArguments **)(local_26a0._0_8_ + 0x10))(&local_2670);
                    auVar47 = ZEXT1664(local_26b0);
                    ray = local_2720;
                    uVar37 = local_2728;
                    if (*local_2670 == 0) goto LAB_00e60a68;
                  }
                  *(undefined4 *)&(local_2658->intersector1).pointQuery = *local_2650;
                  *(undefined4 *)((long)&(local_2658->intersector1).pointQuery + 4) = local_2650[1];
                  *(undefined4 *)&(local_2658->intersector1).name = local_2650[2];
                  *(undefined4 *)((long)&(local_2658->intersector1).name + 4) = local_2650[3];
                  *(undefined4 *)&(local_2658->intersector4).intersect = local_2650[4];
                  *(undefined4 *)((long)&(local_2658->intersector4).intersect + 4) = local_2650[5];
                  *(undefined4 *)&(local_2658->intersector4).occluded = local_2650[6];
                  *(undefined4 *)((long)&(local_2658->intersector4).occluded + 4) = local_2650[7];
                  context = (RayQueryContext *)0x0;
                  *(undefined4 *)&(local_2658->intersector4).name = local_2650[8];
                  pRVar36 = local_26c8;
                }
                else {
                  auVar94 = ZEXT464(local_263c);
                  auVar108 = ZEXT464(local_2638);
                  auVar121 = ZEXT1664(auVar121._0_16_);
                  (**(code **)(lVar29 + 0x40))(&local_2670);
                  auVar47 = ZEXT1664(local_26b0);
                  ray = local_2720;
                  uVar37 = local_2728;
                  if (*local_2670 != 0) goto LAB_00e609a5;
LAB_00e60a68:
                  *(undefined4 *)&(This->intersector1).intersect = local_26c0._0_4_;
                  ray = local_2720;
                  uVar37 = local_2728;
                  pRVar36 = local_26c8;
                }
                *(undefined4 *)(local_26e0 + CONCAT44(fStack_26fc,local_2700) * 4) = 0;
                uVar30 = *(undefined4 *)&(This->intersector1).intersect;
                auVar46._4_4_ = uVar30;
                auVar46._0_4_ = uVar30;
                auVar46._8_4_ = uVar30;
                auVar46._12_4_ = uVar30;
                auVar80 = vcmpps_avx(auVar47._0_16_,auVar46,2);
                local_26e0 = vandps_avx(auVar80,local_26e0);
                auVar6._0_8_ = (This->intersector1).intersect;
                auVar6._8_8_ = (This->intersector1).occluded;
                auVar63 = ZEXT1664(auVar6);
                uVar34 = vextractps_avx(auVar6,1);
              }
              if ((((local_26e0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_26e0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_26e0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_26e0[0xf]) goto LAB_00e60b35;
              auVar61._8_4_ = 0x7f800000;
              auVar61._0_8_ = 0x7f8000007f800000;
              auVar61._12_4_ = 0x7f800000;
              auVar80 = vblendvps_avx(auVar61,auVar47._0_16_,local_26e0);
              auVar112 = vshufps_avx(auVar80,auVar80,0xb1);
              auVar112 = vminps_avx(auVar112,auVar80);
              auVar90 = vshufpd_avx(auVar112,auVar112,1);
              auVar112 = vminps_avx(auVar90,auVar112);
              auVar112 = vcmpps_avx(auVar80,auVar112,0);
              auVar51 = local_26e0 & auVar112;
              auVar80 = local_26e0;
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar51[0xf] < '\0') {
                auVar80 = vandps_avx(auVar112,local_26e0);
              }
              uVar30 = vmovmskps_avx(auVar80);
              uVar31 = CONCAT44((int)((ulong)context >> 0x20),uVar30);
              context = (RayQueryContext *)0x0;
              lVar29 = local_2740;
              if (uVar31 != 0) {
                for (; (uVar31 >> (long)context & 1) == 0;
                    context = (RayQueryContext *)((long)&context->scene + 1)) {
                }
              }
              goto LAB_00e60785;
            }
          }
LAB_00e60b35:
          auVar142 = ZEXT3264(local_23c0);
          auVar150 = ZEXT3264(local_23e0);
          auVar153 = ZEXT3264(local_2400);
          auVar156 = ZEXT3264(local_2420);
          auVar162 = ZEXT3264(local_2440);
          auVar168 = ZEXT3264(local_2460);
          auVar175 = ZEXT3264(local_2480);
          auVar135 = ZEXT3264(local_24a0);
          auVar180 = ZEXT3264(local_24c0);
          auVar126 = ZEXT3264(local_2540);
          lVar29 = local_2690._0_8_ + 1;
        }
        uVar30 = *(undefined4 *)&(This->intersector1).intersect;
        auVar47 = ZEXT3264(CONCAT428(uVar30,CONCAT424(uVar30,CONCAT420(uVar30,CONCAT416(uVar30,
                                                  CONCAT412(uVar30,CONCAT48(uVar30,CONCAT44(uVar30,
                                                  uVar30))))))));
        auVar63 = ZEXT464(*(uint *)&(This->intersector1).intersect);
      }
      goto LAB_00e5fdab;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }